

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceReleaseQueue.hpp
# Opt level: O2

void __thiscall
Diligent::ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper>::Purge
          (ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *this,
          Uint64 CompletedFenceValue)

{
  _Elt_pointer ppVar1;
  
  std::mutex::lock(&this->m_ReleaseQueueMutex);
  while ((ppVar1 = (this->m_ReleaseQueue).
                   super__Deque_base<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::STDAllocator<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::IMemoryAllocator>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur,
         (this->m_ReleaseQueue).
         super__Deque_base<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::STDAllocator<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::IMemoryAllocator>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar1 &&
         (ppVar1->first <= CompletedFenceValue))) {
    std::
    deque<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::STDAllocator<std::pair<unsigned_long,_Diligent::DynamicStaleResourceWrapper>,_Diligent::IMemoryAllocator>_>
    ::pop_front(&this->m_ReleaseQueue);
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void Purge(Uint64 CompletedFenceValue)
    {
        std::lock_guard<std::mutex> LockGuard(m_ReleaseQueueMutex);

        // Release all objects whose associated fence value is at most CompletedFenceValue
        // See http://diligentgraphics.com/diligent-engine/architecture/d3d12/managing-resource-lifetimes/
        while (!m_ReleaseQueue.empty())
        {
            auto& FirstObj = m_ReleaseQueue.front();
            if (FirstObj.first <= CompletedFenceValue)
                m_ReleaseQueue.pop_front();
            else
                break;
        }
    }